

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getIterate(Highs *this)

{
  HighsStatus HVar1;
  HighsBasis HStack_78;
  
  if ((this->ekk_instance_).status_.initialised_for_new_lp == false) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getIterate: no simplex iterate to get\n");
    HVar1 = kError;
  }
  else {
    HVar1 = HEkk::getIterate(&this->ekk_instance_);
    if (HVar1 == kOk) {
      HEkk::getHighsBasis(&HStack_78,&this->ekk_instance_,&(this->model_).lp_);
      HighsBasis::operator=(&this->basis_,&HStack_78);
      HighsBasis::~HighsBasis(&HStack_78);
      invalidateModelStatusSolutionAndInfo(this);
      HVar1 = returnFromHighs(this,kOk);
    }
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getIterate() {
  // Check that there is a simplex iterate to get
  if (!ekk_instance_.status_.initialised_for_new_lp) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getIterate: no simplex iterate to get\n");
    return HighsStatus::kError;
  }
  HighsStatus call_status = ekk_instance_.getIterate();
  if (call_status != HighsStatus::kOk) return call_status;
  // Get the corresponding HiGHS basis
  basis_ = ekk_instance_.getHighsBasis(model_.lp_);
  // Clear everything else
  invalidateModelStatusSolutionAndInfo();
  return returnFromHighs(HighsStatus::kOk);
}